

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::UnpackHalf2x16Case::iterate(UnpackHalf2x16Case *this)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  ShaderExecutor *pSVar4;
  undefined2 uVar5;
  bool bVar6;
  Float<unsigned_short,_5,_10,_15,_3U> FVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  Float<unsigned_int,_8,_23,_127,_3U> FVar10;
  Float<unsigned_int,_8,_23,_127,_3U> FVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  char *description;
  int ndx;
  int iVar15;
  int iVar16;
  Hex<8UL> hex;
  Hex<8UL> hex_00;
  Hex<8UL> hex_01;
  Hex<8UL> hex_02;
  Hex<8UL> hex_03;
  Float<unsigned_short,_5,_10,_15,_3U> local_236;
  int local_234;
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  deUint32 u32_1;
  deUint32 u32;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> outputs;
  Random rnd;
  deUint32 inVal;
  undefined4 uStack_1ac;
  ostringstream local_1a8 [376];
  
  dVar8 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar8 ^ 0x776002);
  inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  outputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float((Float<unsigned_short,_5,_10,_15,_3U> *)&out,0.0)
  ;
  uVar5 = out._0_2_;
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_236,1.0);
  inVal = CONCAT22(uVar5,local_236.m_value);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,&inVal);
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float((Float<unsigned_short,_5,_10,_15,_3U> *)&out,1.0)
  ;
  uVar5 = out._0_2_;
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_236,0.0);
  inVal = CONCAT22(uVar5,local_236.m_value);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,&inVal);
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
            ((Float<unsigned_short,_5,_10,_15,_3U> *)&out,-1.0);
  uVar5 = out._0_2_;
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_236,0.5);
  inVal = CONCAT22(uVar5,local_236.m_value);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,&inVal);
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float((Float<unsigned_short,_5,_10,_15,_3U> *)&out,0.5)
  ;
  tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float(&local_236,-0.5);
  inVal = CONCAT22(out._0_2_,local_236.m_value);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&inputs,&inVal);
  for (iVar15 = 0; iVar15 != 0x60; iVar15 = iVar15 + 1) {
    inVal = 0;
    for (iVar16 = 0; iVar16 != 0x20; iVar16 = iVar16 + 0x10) {
      bVar6 = de::Random::getBool((Random *)&rnd.m_rnd);
      dVar8 = deRandom_getUint32(&rnd.m_rnd);
      dVar9 = deRandom_getUint32(&rnd.m_rnd);
      FVar7 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::construct
                        (bVar6 - 1 | 1,(dVar8 % 0x1e - 0xe) + (uint)(dVar8 % 0x1e == 0xe),
                         (ushort)dVar9 & 0x3ff | 0x400);
      inVal = inVal | (uint)FVar7.m_value << ((byte)iVar16 & 0x1f);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&inputs,&inVal);
  }
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            (&outputs,(long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 2);
  _inVal = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"Executing shader for ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::operator<<((ostream *)local_1a8," input values");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&inVal,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  _inVal = (TestLog *)
           inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  out = outputs.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
        _M_impl.super__Vector_impl_data._M_start;
  (*((this->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar4 = (this->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar4->_vptr_ShaderExecutor[6])
            (pSVar4,(ulong)((long)inputs.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)inputs.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2,&inVal,&out);
  uVar13 = (long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  lVar14 = 0;
  local_234 = 0;
  do {
    if ((int)((ulong)((long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 2) <= lVar14) {
      _inVal = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode
               .m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      iVar15 = (int)(uVar13 >> 2);
      std::ostream::operator<<(local_1a8,iVar15 - local_234);
      std::operator<<((ostream *)local_1a8," / ");
      std::ostream::operator<<(local_1a8,iVar15);
      std::operator<<((ostream *)local_1a8," values passed");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&inVal,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      description = "Pass";
      if (local_234 != 0) {
        description = "Result comparison failed";
      }
      tcu::TestContext::setTestResult
                ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx,(uint)(local_234 != 0),description);
      std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
      ~_Vector_base(&outputs.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   );
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      return STOP;
    }
    uVar1 = inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar14];
    inVal._0_2_ = (short)uVar1;
    FVar10 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                       ((Float<unsigned_short,_5,_10,_15,_3U> *)&inVal);
    _inVal = (TestLog *)CONCAT62(stack0xfffffffffffffe52,(short)(uVar1 >> 0x10));
    FVar11 = tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_short,5,10,15,3u>
                       ((Float<unsigned_short,_5,_10,_15,_3U> *)&inVal);
    fVar2 = outputs.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar14].m_data[0];
    fVar3 = outputs.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar14].m_data[1];
    iVar16 = FVar10.m_value - (int)fVar2;
    iVar15 = -iVar16;
    if (0 < iVar16) {
      iVar15 = iVar16;
    }
    iVar12 = FVar11.m_value - (int)fVar3;
    iVar16 = -iVar12;
    if (0 < iVar12) {
      iVar16 = iVar12;
    }
    if ((0 < iVar15) || (0 < iVar16)) {
      if (local_234 < 10) {
        _inVal = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                  super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,"ERROR: Mismatch in value ");
        std::ostream::operator<<(local_1a8,(int)lVar14);
        std::operator<<((ostream *)local_1a8,",\n");
        std::operator<<((ostream *)local_1a8,"  expected unpackHalf2x16(");
        hex.value._4_4_ = 0;
        hex.value._0_4_ =
             inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar14];
        tcu::Format::operator<<((ostream *)local_1a8,hex);
        std::operator<<((ostream *)local_1a8,") = ");
        std::operator<<((ostream *)local_1a8,"vec2(");
        std::ostream::operator<<(local_1a8,(float)FVar10.m_value);
        std::operator<<((ostream *)local_1a8," / ");
        hex_00.value._4_4_ = 0;
        hex_00.value._0_4_ = FVar10.m_value;
        tcu::Format::operator<<((ostream *)local_1a8,hex_00);
        std::operator<<((ostream *)local_1a8,", ");
        std::ostream::operator<<(local_1a8,(float)FVar11.m_value);
        std::operator<<((ostream *)local_1a8," / ");
        hex_01.value._4_4_ = 0;
        hex_01.value._0_4_ = FVar11.m_value;
        tcu::Format::operator<<((ostream *)local_1a8,hex_01);
        std::operator<<((ostream *)local_1a8,")");
        std::operator<<((ostream *)local_1a8,", got vec2(");
        std::ostream::operator<<(local_1a8,fVar2);
        std::operator<<((ostream *)local_1a8," / ");
        hex_02.value._4_4_ = 0;
        hex_02.value._0_4_ = fVar2;
        tcu::Format::operator<<((ostream *)local_1a8,hex_02);
        std::operator<<((ostream *)local_1a8,", ");
        std::ostream::operator<<(local_1a8,fVar3);
        std::operator<<((ostream *)local_1a8," / ");
        hex_03.value._4_4_ = 0;
        hex_03.value._0_4_ = fVar3;
        tcu::Format::operator<<((ostream *)local_1a8,hex_03);
        std::operator<<((ostream *)local_1a8,")");
        std::operator<<((ostream *)local_1a8,"\n  ULP diffs = (");
        std::ostream::operator<<(local_1a8,iVar15);
        std::operator<<((ostream *)local_1a8,", ");
        std::ostream::operator<<(local_1a8,iVar16);
        std::operator<<((ostream *)local_1a8,"), max diff = ");
        std::ostream::operator<<(local_1a8,0);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&inVal,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_012791ae:
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
      }
      else if (local_234 == 10) {
        _inVal = ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                  super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::operator<<((ostream *)local_1a8,"...");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&inVal,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_012791ae;
      }
      local_234 = local_234 + 1;
    }
    lVar14 = lVar14 + 1;
  } while( true );
}

Assistant:

IterateResult iterate (void)
	{
		const int					maxDiff		= 0; // All bits must be accurate.
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec2>		outputs;

		// Special values.
		inputs.push_back((tcu::Float16( 0.0f).bits() << 16) | tcu::Float16( 1.0f).bits());
		inputs.push_back((tcu::Float16( 1.0f).bits() << 16) | tcu::Float16( 0.0f).bits());
		inputs.push_back((tcu::Float16(-1.0f).bits() << 16) | tcu::Float16( 0.5f).bits());
		inputs.push_back((tcu::Float16( 0.5f).bits() << 16) | tcu::Float16(-0.5f).bits());

		// Construct random values.
		{
			const int	minExp		= -14;
			const int	maxExp		= 15;
			const int	mantBits	= 10;

			for (int ndx = 0; ndx < 96; ndx++)
			{
				deUint32 inVal = 0;
				for (int c = 0; c < 2; c++)
				{
					const int		s			= rnd.getBool() ? 1 : -1;
					const int		exp			= rnd.getInt(minExp, maxExp);
					const deUint32	mantissa	= rnd.getUint32() & ((1<<mantBits)-1);
					const deUint16	value		= tcu::Float16::construct(s, exp ? exp : 1 /* avoid denorm */, (deUint16)((1u<<10) | mantissa)).bits();

					inVal |= value << (16*c);
				}
				inputs.push_back(inVal);
			}
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint16	in0			= (deUint16)(inputs[valNdx] & 0xffff);
				const deUint16	in1			= (deUint16)(inputs[valNdx] >> 16);
				const float		ref0		= tcu::Float16(in0).asFloat();
				const float		ref1		= tcu::Float16(in1).asFloat();
				const float		res0		= outputs[valNdx].x();
				const float		res1		= outputs[valNdx].y();

				const deUint32	refBits0	= tcu::Float32(ref0).bits();
				const deUint32	refBits1	= tcu::Float32(ref1).bits();
				const deUint32	resBits0	= tcu::Float32(res0).bits();
				const deUint32	resBits1	= tcu::Float32(res1).bits();

				const int		diff0	= de::abs((int)refBits0 - (int)resBits0);
				const int		diff1	= de::abs((int)refBits1 - (int)resBits1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackHalf2x16(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec2(" << ref0 << " / " << tcu::toHex(refBits0) << ", " << ref1 << " / " << tcu::toHex(refBits1) << ")"
															   << ", got vec2(" << res0 << " / " << tcu::toHex(resBits0) << ", " << res1 << " / " << tcu::toHex(resBits1) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}